

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

void close_settings_r(settings_r *handle)

{
  undefined8 *e;
  
  if (handle != (settings_r *)0x0) {
    e = (undefined8 *)index234(handle->t,0);
    while (e != (undefined8 *)0x0) {
      del234(handle->t,e);
      safefree((void *)*e);
      safefree((void *)e[1]);
      safefree(e);
      e = (undefined8 *)index234(handle->t,0);
    }
    freetree234(handle->t);
    safefree(handle);
    return;
  }
  return;
}

Assistant:

void close_settings_r(settings_r *handle)
{
    struct skeyval *kv;

    if (!handle)
        return;

    while ( (kv = index234(handle->t, 0)) != NULL) {
        del234(handle->t, kv);
        sfree((char *)kv->key);
        sfree((char *)kv->value);
        sfree(kv);
    }

    freetree234(handle->t);
    sfree(handle);
}